

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.cpp
# Opt level: O1

void __thiscall btBoxShape::calculateLocalInertia(btBoxShape *this,btScalar mass,btVector3 *inertia)

{
  undefined8 uVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float local_28;
  float fStack_24;
  
  uVar1 = *(undefined8 *)
           (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
           m_implicitShapeDimensions.m_floats;
  fVar2 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          m_implicitShapeDimensions.m_floats[2];
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])();
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  fVar2 = extraout_XMM0_Da_01 + fVar2;
  fVar2 = fVar2 + fVar2;
  fVar3 = mass / 12.0;
  fVar2 = fVar2 * fVar2;
  local_28 = (float)uVar1;
  fStack_24 = (float)((ulong)uVar1 >> 0x20);
  fVar4 = extraout_XMM0_Da + local_28 + extraout_XMM0_Da + local_28;
  fVar5 = extraout_XMM0_Da_00 + fStack_24 + extraout_XMM0_Da_00 + fStack_24;
  fVar5 = fVar5 * fVar5;
  *(ulong *)inertia->m_floats = CONCAT44((fVar4 * fVar4 + fVar2) * fVar3,(fVar5 + fVar2) * fVar3);
  inertia->m_floats[2] = (fVar4 * fVar4 + fVar5) * fVar3;
  inertia->m_floats[3] = 0.0;
  return;
}

Assistant:

void	btBoxShape::calculateLocalInertia(btScalar mass,btVector3& inertia) const
{
	//btScalar margin = btScalar(0.);
	btVector3 halfExtents = getHalfExtentsWithMargin();

	btScalar lx=btScalar(2.)*(halfExtents.x());
	btScalar ly=btScalar(2.)*(halfExtents.y());
	btScalar lz=btScalar(2.)*(halfExtents.z());

	inertia.setValue(mass/(btScalar(12.0)) * (ly*ly + lz*lz),
					mass/(btScalar(12.0)) * (lx*lx + lz*lz),
					mass/(btScalar(12.0)) * (lx*lx + ly*ly));

}